

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ugui.c
# Opt level: O3

void ugui_put_event(ugui_t *gui,uint8_t event)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,event) != 0) {
    _ugui_window_put_event(gui->windows[gui->window_index - 1],(uint)event);
    return;
  }
  return;
}

Assistant:

void ugui_put_event(ugui_t* gui, uint8_t event)
{
	//Bypass for null events
	if(event == UGUI_EVT_NONE) {
		return;
	}
	//Pass event to active window handler
	ugui_window_t *current = gui->windows[gui->window_index - 1];
	_ugui_window_put_event(current, event);
}